

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_u64_decimal(CBS *cbs,uint64_t *out)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  ulong uVar5;
  int local_2c;
  uint8_t c;
  ulong uStack_28;
  int seen_digit;
  uint64_t v;
  uint64_t *out_local;
  CBS *cbs_local;
  
  uStack_28 = 0;
  local_2c = 0;
  while (sVar3 = CBS_len(cbs), sVar3 != 0) {
    pbVar4 = CBS_data(cbs);
    bVar1 = *pbVar4;
    iVar2 = OPENSSL_isdigit((uint)bVar1);
    if (iVar2 == 0) break;
    CBS_skip(cbs,1);
    if ((((uStack_28 == 0) && (local_2c != 0)) || (0x1999999999999999 < uStack_28)) ||
       (uVar5 = -(long)(int)(bVar1 - 0x30) - 1,
       uVar5 <= uStack_28 * 10 && uStack_28 * 10 - uVar5 != 0)) {
      return 0;
    }
    uStack_28 = uStack_28 * 10 + (long)(int)(bVar1 - 0x30);
    local_2c = 1;
  }
  *out = uStack_28;
  return local_2c;
}

Assistant:

int CBS_get_u64_decimal(CBS *cbs, uint64_t *out) {
  uint64_t v = 0;
  int seen_digit = 0;
  while (CBS_len(cbs) != 0) {
    uint8_t c = CBS_data(cbs)[0];
    if (!OPENSSL_isdigit(c)) {
      break;
    }
    CBS_skip(cbs, 1);
    if (/* Forbid stray leading zeros */
        (v == 0 && seen_digit) ||
        // Check for overflow.
        v > UINT64_MAX / 10 ||  //
        v * 10 > UINT64_MAX - (c - '0')) {
      return 0;
    }
    v = v * 10 + (c - '0');
    seen_digit = 1;
  }

  *out = v;
  return seen_digit;
}